

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
typeCheckValue(UA_Server *server,UA_NodeId *targetDataTypeId,UA_Int32 targetValueRank,
              size_t targetArrayDimensionsSize,UA_UInt32 *targetArrayDimensions,UA_Variant *value,
              UA_NumericRange *range,UA_Variant *editableValue)

{
  UA_DataType *t;
  size_t *psVar1;
  size_t sVar2;
  void *pvVar3;
  UA_UInt32 *pUVar4;
  UA_VariantStorageType UVar5;
  undefined4 uVar6;
  UA_Boolean UVar7;
  UA_StatusCode UVar8;
  type_equivalence tVar9;
  type_equivalence tVar10;
  UA_DataType *t_00;
  UA_Byte *testArrayDimensions;
  size_t testArrayDimensionsSize;
  size_t sVar11;
  undefined1 local_80 [8];
  UA_NodeId subtypeId;
  UA_UInt32 tempArrayDimensions;
  
  t = value->type;
  if (t != (UA_DataType *)0x0) {
    UVar7 = UA_NodeId_equal(&t->typeId,targetDataTypeId);
    if (!UVar7) {
      local_80._0_2_ = 0;
      stack0xffffffffffffff84 = 0x2d00000000;
      UVar7 = isNodeInTree(server->nodestore,&t->typeId,targetDataTypeId,(UA_NodeId *)local_80,1);
      if (!UVar7) {
        if (editableValue == (UA_Variant *)0x0) {
          return 0x80740000;
        }
        t_00 = UA_findDataType(targetDataTypeId);
        if (t_00 == (UA_DataType *)0x0) {
          return 0x80740000;
        }
        if (((t == UA_TYPES + 0xe && t_00 == UA_TYPES + 2) && (value->arrayLength == 0)) &&
           (psVar1 = (size_t *)value->data, (size_t *)0x1 < psVar1)) {
          editableValue->storageType = UA_VARIANT_DATA_NODELETE;
          editableValue->type = (UA_DataType *)0x13b3f0;
          editableValue->arrayLength = *psVar1;
          editableValue->data = (void *)psVar1[1];
          value = editableValue;
        }
        else {
          tVar9 = typeEquivalence(t_00);
          tVar10 = typeEquivalence(t);
          if (tVar9 == TYPE_EQUIVALENCE_NONE) {
            return 0x80740000;
          }
          if (tVar9 != tVar10) {
            return 0x80740000;
          }
          UVar5 = value->storageType;
          uVar6 = *(undefined4 *)&value->field_0xc;
          sVar11 = value->arrayLength;
          pvVar3 = value->data;
          sVar2 = value->arrayDimensionsSize;
          pUVar4 = value->arrayDimensions;
          editableValue->type = value->type;
          editableValue->storageType = UVar5;
          *(undefined4 *)&editableValue->field_0xc = uVar6;
          editableValue->arrayDimensionsSize = sVar2;
          editableValue->arrayDimensions = pUVar4;
          editableValue->arrayLength = sVar11;
          editableValue->data = pvVar3;
          editableValue->storageType = UA_VARIANT_DATA_NODELETE;
          editableValue->type = t_00;
          value = editableValue;
        }
      }
    }
  }
  UVar8 = 0;
  if (range == (UA_NumericRange *)0x0) {
    sVar2 = 1;
    sVar11 = value->arrayDimensionsSize;
    testArrayDimensions = (UA_Byte *)value->arrayDimensions;
    testArrayDimensionsSize = sVar11;
    if (testArrayDimensions == (UA_Byte *)0x0) {
      if ((value->arrayLength == 0) && ((void *)0x1 < value->data)) {
        testArrayDimensions = (UA_Byte *)0x0;
      }
      else {
        testArrayDimensions = subtypeId.identifier.guid.data4 + 4;
        subtypeId.identifier._12_4_ = (undefined4)value->arrayLength;
        testArrayDimensionsSize = sVar2;
      }
    }
    if (targetArrayDimensionsSize == 0) {
      UVar8 = 0;
      if (value->data != (void *)0x0) {
        if (value->arrayLength != 0) {
          sVar11 = sVar2;
        }
        if (value->data < (void *)0x2) {
          sVar11 = sVar2;
        }
        UVar8 = compatibleValueRankArrayDimensions(targetValueRank,sVar11);
        return UVar8;
      }
    }
    else {
      UVar8 = compatibleArrayDimensions
                        (targetArrayDimensionsSize,targetArrayDimensions,testArrayDimensionsSize,
                         (UA_UInt32 *)testArrayDimensions);
    }
  }
  return UVar8;
}

Assistant:

UA_StatusCode
typeCheckValue(UA_Server *server, const UA_NodeId *targetDataTypeId,
               UA_Int32 targetValueRank, size_t targetArrayDimensionsSize,
               const UA_UInt32 *targetArrayDimensions, const UA_Variant *value,
               const UA_NumericRange *range, UA_Variant *editableValue) {
    /* Empty variant is only allowed for BaseDataType */
    if(!value->type)
        goto check_array;

    /* See if the types match. The nodeid on the wire may be != the nodeid in
     * the node for opaque types, enums and bytestrings. value contains the
     * correct type definition after the following paragraph */
    if(UA_NodeId_equal(&value->type->typeId, targetDataTypeId))
        goto check_array;

    /* Has the value a subtype of the required type? */
    const UA_NodeId subtypeId = UA_NODEID_NUMERIC(0, UA_NS0ID_HASSUBTYPE);
    if(isNodeInTree(server->nodestore, &value->type->typeId, targetDataTypeId, &subtypeId, 1))
        goto check_array;

    /* Try to convert to a matching value if this is wanted */
    if(!editableValue)
        return UA_STATUSCODE_BADTYPEMISMATCH;
    value = convertToMatchingValue(server, value, targetDataTypeId, editableValue);
    if(!value)
        return UA_STATUSCODE_BADTYPEMISMATCH;

 check_array:
    if(range) /* array dimensions are checked later when writing the range */
        return UA_STATUSCODE_GOOD;

    size_t valueArrayDimensionsSize = value->arrayDimensionsSize;
    UA_UInt32 *valueArrayDimensions = value->arrayDimensions;
    UA_UInt32 tempArrayDimensions;
    if(valueArrayDimensions == 0 && !UA_Variant_isScalar(value)) {
        valueArrayDimensionsSize = 1;
        tempArrayDimensions = (UA_UInt32)value->arrayLength;
        valueArrayDimensions = &tempArrayDimensions;
    }

    /* See if the array dimensions match. When arrayDimensions are defined, they
     * already hold the valuerank. */
    if(targetArrayDimensionsSize > 0)
        return compatibleArrayDimensions(targetArrayDimensionsSize, targetArrayDimensions,
                                         valueArrayDimensionsSize, valueArrayDimensions);

    /* Check if the valuerank allows for the value dimension */
    return compatibleValueRankValue(targetValueRank, value);
}